

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O1

Id dxil_spv::emit_coopmat_transpose(Impl *impl,Id v,uint32_t input_imm,uint32_t output_imm)

{
  uint uVar1;
  Id IVar2;
  Id IVar3;
  Id IVar4;
  uint uVar5;
  Builder *this;
  Operation *pOVar6;
  LoggingCallback p_Var7;
  Operation *pOVar8;
  void *pvVar9;
  char buffer [4096];
  Id local_1038 [4];
  undefined1 uStack_1028;
  char acStack_1027 [4087];
  
  this = Converter::Impl::builder(impl);
  if (((input_imm & 0x70) != 0) && ((input_imm & 0xf) == 10 && (output_imm & 0x70) != 0)) {
    IVar2 = build_coopmat_type(impl,input_imm);
    IVar3 = build_coopmat_type(impl,output_imm);
    local_1038[1] = IVar3;
    local_1038[0] = IVar2;
    local_1038[2] = 0;
    IVar4 = SPIRVModule::get_helper_call_id(impl->spirv_module,CoopMatTransfer,local_1038,2);
    IVar2 = Converter::Impl::create_variable(impl,StorageClassFunction,IVar2,(char *)0x0);
    pOVar6 = Converter::Impl::allocate(impl,OpStore);
    Operation::add_id(pOVar6,IVar2);
    Operation::add_id(pOVar6,v);
    Converter::Impl::add(impl,pOVar6,false);
    pOVar6 = Converter::Impl::allocate(impl,OpFunctionCall,IVar3);
    Operation::add_id(pOVar6,IVar4);
    Operation::add_id(pOVar6,IVar2);
    Converter::Impl::add(impl,pOVar6,false);
    return pOVar6->id;
  }
  if ((impl->ags).coopmat_transpose_scratch == 0) {
    IVar2 = spv::Builder::makeIntegerType(this,0x20,false);
    uVar1 = (impl->execution_mode_meta).wave_size_min;
    uVar5 = (impl->execution_mode_meta).workgroup_threads[1] *
            (impl->execution_mode_meta).workgroup_threads[0] *
            (impl->execution_mode_meta).workgroup_threads[2];
    if ((uVar1 == 0) && (uVar1 = (impl->options).subgroup_size.implementation_minimum, uVar1 == 0))
    {
      p_Var7 = get_thread_log_callback();
      if (p_Var7 == (LoggingCallback)0x0) {
        emit_coopmat_transpose();
      }
      else {
        memcpy(local_1038,
               "Need LDS transpose, but there is no estimate for how large the LDS buffer needs to be.\n"
               ,0x58);
LAB_00180139:
        pvVar9 = get_thread_log_callback_userdata();
        (*p_Var7)(pvVar9,Error,(char *)local_1038);
      }
    }
    else {
      if (uVar1 <= uVar5) {
        IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
        IVar3 = spv::Builder::makeIntConstant(this,IVar3,uVar5 / uVar1 << 8,false);
        IVar2 = spv::Builder::makeArrayType(this,IVar2,IVar3,0);
        IVar2 = Converter::Impl::create_variable
                          (impl,StorageClassWorkgroup,IVar2,"LDSTransposeScratch");
        (impl->ags).coopmat_transpose_scratch = IVar2;
        goto LAB_0017fd8f;
      }
      p_Var7 = get_thread_log_callback();
      if (p_Var7 != (LoggingCallback)0x0) {
        uStack_1028 = 0x70;
        builtin_strncpy(acStack_1027," size.\n",8);
        local_1038._0_8_ = 0x2064696c61766e49;
        local_1038[2] = 0x6b726f77;
        local_1038[3] = 0x756f7267;
        goto LAB_00180139;
      }
      emit_coopmat_transpose();
    }
    IVar2 = 0;
  }
  else {
LAB_0017fd8f:
    IVar2 = 0;
    if ((input_imm & 0xf) != 6 && (input_imm & 0xf) == (output_imm & 0xf)) {
      IVar3 = SPIRVModule::get_builtin_shader_input(impl->spirv_module,BuiltInSubgroupId);
      IVar2 = 0;
      IVar4 = spv::Builder::makeIntegerType(this,0x20,false);
      pOVar6 = Converter::Impl::allocate(impl,OpLoad,IVar4);
      Operation::add_id(pOVar6,IVar3);
      Converter::Impl::add(impl,pOVar6,false);
      IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
      pOVar8 = Converter::Impl::allocate(impl,OpIMul,IVar3);
      Operation::add_id(pOVar8,pOVar6->id);
      IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
      IVar3 = spv::Builder::makeIntConstant(this,IVar3,0x100,false);
      Operation::add_id(pOVar8,IVar3);
      Converter::Impl::add(impl,pOVar8,false);
      IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
      IVar3 = spv::Builder::makePointer(this,StorageClassWorkgroup,IVar3);
      pOVar6 = Converter::Impl::allocate(impl,OpInBoundsAccessChain,IVar3);
      Operation::add_id(pOVar6,(impl->ags).coopmat_transpose_scratch);
      Operation::add_id(pOVar6,pOVar8->id);
      Converter::Impl::add(impl,pOVar6,false);
      pOVar8 = Converter::Impl::allocate(impl,OpControlBarrier);
      IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
      IVar3 = spv::Builder::makeIntConstant(this,IVar3,3,false);
      Operation::add_id(pOVar8,IVar3);
      IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
      IVar3 = spv::Builder::makeIntConstant(this,IVar3,2,false);
      Operation::add_id(pOVar8,IVar3);
      IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
      IVar3 = spv::Builder::makeIntConstant(this,IVar3,0x108,false);
      Operation::add_id(pOVar8,IVar3);
      Converter::Impl::add(impl,pOVar8,false);
      pOVar8 = Converter::Impl::allocate(impl,OpCooperativeMatrixStoreKHR);
      Operation::add_id(pOVar8,pOVar6->id);
      Operation::add_id(pOVar8,v);
      IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
      IVar3 = spv::Builder::makeIntConstant(this,IVar3,1,false);
      Operation::add_id(pOVar8,IVar3);
      IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
      IVar3 = spv::Builder::makeIntConstant(this,IVar3,0x10,false);
      Operation::add_id(pOVar8,IVar3);
      Converter::Impl::add(impl,pOVar8,false);
      pOVar8 = Converter::Impl::allocate(impl,OpControlBarrier);
      IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
      IVar3 = spv::Builder::makeIntConstant(this,IVar3,3,false);
      Operation::add_id(pOVar8,IVar3);
      IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
      IVar3 = spv::Builder::makeIntConstant(this,IVar3,2,false);
      Operation::add_id(pOVar8,IVar3);
      IVar3 = spv::Builder::makeIntegerType(this,0x20,false);
      IVar3 = spv::Builder::makeIntConstant(this,IVar3,0x108,false);
      Operation::add_id(pOVar8,IVar3);
      Converter::Impl::add(impl,pOVar8,false);
      IVar3 = build_coopmat_type(impl,output_imm);
      if (IVar3 != 0) {
        pOVar8 = Converter::Impl::allocate(impl,OpCooperativeMatrixLoadKHR,IVar3);
        Operation::add_id(pOVar8,pOVar6->id);
        IVar2 = spv::Builder::makeIntegerType(this,0x20,false);
        IVar2 = spv::Builder::makeIntConstant(this,IVar2,1,false);
        Operation::add_id(pOVar8,IVar2);
        IVar2 = spv::Builder::makeIntegerType(this,0x20,false);
        IVar2 = spv::Builder::makeIntConstant(this,IVar2,0x10,false);
        Operation::add_id(pOVar8,IVar2);
        Converter::Impl::add(impl,pOVar8,false);
        IVar2 = pOVar8->id;
      }
    }
  }
  return IVar2;
}

Assistant:

static spv::Id emit_coopmat_transpose(Converter::Impl &impl, spv::Id v, uint32_t input_imm, uint32_t output_imm)
{
	auto &builder = impl.builder();

	if (get_matrix_type(input_imm) != AmdExtD3DShaderIntrinsicsWaveMatrixType_A &&
	    get_matrix_type(output_imm) != AmdExtD3DShaderIntrinsicsWaveMatrixType_A &&
	    get_type_data_format(input_imm) == AmdExtD3DShaderIntrinsicsWaveMatrixDataFormat_FP8)
	{
		// It appears that in the cases we care about, layout of B and C are the same.
		// Just do element-wise copy here to avoid the bad roundtrip.
		// This assumption only seems to hold for FP8, but that's the only case we care about.
		return emit_coopmat_transfer(impl, v, input_imm, output_imm);
	}

	if (!impl.ags.coopmat_transpose_scratch)
	{
		spv::Id lds_type_id = builder.makeUintType(32);
		uint32_t num_elements = 16 * 16;

		// Assume that the workgroup is aligned.
		uint32_t max_num_workgroups = impl.execution_mode_meta.workgroup_threads[0] *
		                              impl.execution_mode_meta.workgroup_threads[1] *
		                              impl.execution_mode_meta.workgroup_threads[2];

		if (impl.execution_mode_meta.wave_size_min)
			max_num_workgroups /= impl.execution_mode_meta.wave_size_min;
		else if (impl.options.subgroup_size.implementation_minimum)
			max_num_workgroups /= impl.options.subgroup_size.implementation_minimum;
		else
		{
			LOGE("Need LDS transpose, but there is no estimate for how large the LDS buffer needs to be.\n");
			return 0;
		}

		if (!max_num_workgroups)
		{
			LOGE("Invalid workgroup size.\n");
			return 0;
		}

		num_elements *= max_num_workgroups;

		lds_type_id = builder.makeArrayType(lds_type_id, builder.makeUintConstant(num_elements), 0);
		impl.ags.coopmat_transpose_scratch =
		    impl.create_variable(spv::StorageClassWorkgroup, lds_type_id, "LDSTransposeScratch");
	}

	if (get_type_data_format(input_imm) != get_type_data_format(output_imm))
		return 0;
	if (get_type_data_format(input_imm) == AmdExtD3DShaderIntrinsicsWaveMatrixDataFormat_F32)
		return 0;

	spv::Id subgroup_id_var = impl.spirv_module.get_builtin_shader_input(spv::BuiltInSubgroupId);
	auto *subgroup_id = impl.allocate(spv::OpLoad, builder.makeUintType(32));
	subgroup_id->add_id(subgroup_id_var);
	impl.add(subgroup_id);

	auto *index = impl.allocate(spv::OpIMul, builder.makeUintType(32));
	index->add_id(subgroup_id->id);
	index->add_id(builder.makeUintConstant(16 * 16));
	impl.add(index);

	auto *chain = impl.allocate(spv::OpInBoundsAccessChain,
	                            builder.makePointer(spv::StorageClassWorkgroup, builder.makeUintType(32)));
	chain->add_id(impl.ags.coopmat_transpose_scratch);
	chain->add_id(index->id);
	impl.add(chain);

	auto *barrier = impl.allocate(spv::OpControlBarrier);
	barrier->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
	barrier->add_id(builder.makeUintConstant(spv::ScopeWorkgroup));
	barrier->add_id(builder.makeUintConstant(spv::MemorySemanticsWorkgroupMemoryMask | spv::MemorySemanticsAcquireReleaseMask));
	impl.add(barrier);

	auto *store = impl.allocate(spv::OpCooperativeMatrixStoreKHR);
	store->add_id(chain->id);
	store->add_id(v);
	store->add_id(builder.makeUintConstant(spv::CooperativeMatrixLayoutColumnMajorKHR));
	store->add_id(builder.makeUintConstant(16));
	impl.add(store);

	barrier = impl.allocate(spv::OpControlBarrier);
	barrier->add_id(builder.makeUintConstant(spv::ScopeSubgroup));
	barrier->add_id(builder.makeUintConstant(spv::ScopeWorkgroup));
	barrier->add_id(builder.makeUintConstant(spv::MemorySemanticsWorkgroupMemoryMask | spv::MemorySemanticsAcquireReleaseMask));
	impl.add(barrier);

	spv::Id output_type = build_coopmat_type(impl, output_imm);
	if (!output_type)
		return 0;

	auto *load = impl.allocate(spv::OpCooperativeMatrixLoadKHR, output_type);
	load->add_id(chain->id);
	load->add_id(builder.makeUintConstant(spv::CooperativeMatrixLayoutColumnMajorKHR));
	load->add_id(builder.makeUintConstant(16));
	impl.add(load);

	return load->id;
}